

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledMisc.cpp
# Opt level: O3

void Imf_2_5::precalculateTileInfo
               (TileDescription *tileDesc,int minX,int maxX,int minY,int maxY,int **numXTiles,
               int **numYTiles,int *numXLevels,int *numYLevels)

{
  LevelMode LVar1;
  int *piVar2;
  ArgExc *this;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  LevelRoundingMode local_54;
  
  LVar1 = tileDesc->mode;
  if (LVar1 == RIPMAP_LEVELS) {
    iVar7 = maxX - minX;
    if (tileDesc->roundingMode == ROUND_DOWN) {
      if (iVar7 < 1) goto LAB_005c487f;
      iVar3 = 0;
      uVar8 = (ulong)(iVar7 + 1);
      do {
        iVar3 = iVar3 + 1;
        uVar4 = (uint)uVar8;
        uVar8 = uVar8 >> 1;
      } while (3 < uVar4);
LAB_005c4818:
      *numXLevels = iVar3 + 1;
      local_54 = tileDesc->roundingMode;
      if (LVar1 == ONE_LEVEL) goto LAB_005c48c7;
      if (LVar1 != RIPMAP_LEVELS) {
        if (LVar1 != MIPMAP_LEVELS) {
LAB_005c498d:
          this = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(this,"Unknown LevelMode format.");
          __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
        }
        goto LAB_005c4839;
      }
    }
    else {
      if (0 < iVar7) {
        iVar3 = 0;
        iVar6 = 0;
        uVar8 = (ulong)(iVar7 + 1);
        do {
          if ((uVar8 & 1) != 0) {
            iVar3 = 1;
          }
          iVar6 = iVar6 + 1;
          uVar4 = (uint)uVar8;
          uVar8 = uVar8 >> 1;
        } while (3 < uVar4);
LAB_005c47df:
        iVar3 = iVar3 + iVar6;
        goto LAB_005c4818;
      }
LAB_005c487f:
      *numXLevels = 1;
      local_54 = tileDesc->roundingMode;
    }
    iVar7 = maxY - minY;
    if (local_54 == ROUND_DOWN) {
      if (iVar7 < 1) goto LAB_005c48fe;
      iVar3 = 0;
      uVar8 = (ulong)(iVar7 + 1);
      do {
        iVar3 = iVar3 + 1;
        uVar4 = (uint)uVar8;
        uVar8 = uVar8 >> 1;
      } while (3 < uVar4);
    }
    else {
      if (iVar7 < 1) goto LAB_005c48fe;
      iVar3 = 0;
      iVar6 = 0;
      uVar8 = (ulong)(iVar7 + 1);
      do {
        if ((uVar8 & 1) != 0) {
          iVar3 = 1;
        }
        iVar6 = iVar6 + 1;
        uVar4 = (uint)uVar8;
        uVar8 = uVar8 >> 1;
      } while (3 < uVar4);
LAB_005c48be:
      iVar3 = iVar3 + iVar6;
    }
  }
  else {
    if (LVar1 != MIPMAP_LEVELS) {
      if (LVar1 != ONE_LEVEL) goto LAB_005c498d;
      *numXLevels = 1;
      local_54 = tileDesc->roundingMode;
LAB_005c48c7:
      uVar4 = 1;
      goto LAB_005c4904;
    }
    uVar5 = (maxX - minX) + 1;
    uVar4 = (maxY - minY) + 1;
    if ((int)uVar4 < (int)uVar5) {
      uVar4 = uVar5;
    }
    if (tileDesc->roundingMode == ROUND_DOWN) {
      if (1 < (int)uVar4) {
        iVar3 = 0;
        uVar8 = (ulong)uVar4;
        do {
          iVar3 = iVar3 + 1;
          uVar4 = (uint)uVar8;
          uVar8 = uVar8 >> 1;
        } while (3 < uVar4);
        goto LAB_005c4818;
      }
    }
    else if (1 < (int)uVar4) {
      iVar3 = 0;
      iVar6 = 0;
      uVar8 = (ulong)uVar4;
      do {
        if ((uVar8 & 1) != 0) {
          iVar3 = 1;
        }
        iVar6 = iVar6 + 1;
        uVar4 = (uint)uVar8;
        uVar8 = uVar8 >> 1;
      } while (3 < uVar4);
      goto LAB_005c47df;
    }
    *numXLevels = 1;
    local_54 = tileDesc->roundingMode;
LAB_005c4839:
    uVar5 = (maxX - minX) + 1;
    uVar4 = (maxY - minY) + 1;
    if ((int)uVar4 < (int)uVar5) {
      uVar4 = uVar5;
    }
    if (local_54 == ROUND_DOWN) {
      if (1 < (int)uVar4) {
        iVar3 = 0;
        uVar8 = (ulong)uVar4;
        do {
          iVar3 = iVar3 + 1;
          uVar4 = (uint)uVar8;
          uVar8 = uVar8 >> 1;
        } while (3 < uVar4);
        goto LAB_005c4901;
      }
    }
    else if (1 < (int)uVar4) {
      iVar3 = 0;
      iVar6 = 0;
      uVar8 = (ulong)uVar4;
      do {
        if ((uVar8 & 1) != 0) {
          iVar3 = 1;
        }
        iVar6 = iVar6 + 1;
        uVar4 = (uint)uVar8;
        uVar8 = uVar8 >> 1;
      } while (3 < uVar4);
      goto LAB_005c48be;
    }
LAB_005c48fe:
    iVar3 = 0;
  }
LAB_005c4901:
  uVar4 = iVar3 + 1;
LAB_005c4904:
  *numYLevels = uVar4;
  iVar7 = *numXLevels;
  uVar8 = (long)iVar7 * 4;
  if ((long)iVar7 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  piVar2 = (int *)operator_new__(uVar8);
  *numXTiles = piVar2;
  uVar8 = (ulong)uVar4 << 2;
  if ((int)uVar4 < 0) {
    uVar8 = 0xffffffffffffffff;
  }
  piVar2 = (int *)operator_new__(uVar8);
  *numYTiles = piVar2;
  anon_unknown_15::calculateNumTiles(*numXTiles,iVar7,minX,maxX,tileDesc->xSize,local_54);
  anon_unknown_15::calculateNumTiles
            (*numYTiles,*numYLevels,minY,maxY,tileDesc->ySize,tileDesc->roundingMode);
  return;
}

Assistant:

void
precalculateTileInfo (const TileDescription& tileDesc,
		      int minX, int maxX,
		      int minY, int maxY,
		      int *&numXTiles, int *&numYTiles,
		      int &numXLevels, int &numYLevels)
{
    numXLevels = calculateNumXLevels(tileDesc, minX, maxX, minY, maxY);
    numYLevels = calculateNumYLevels(tileDesc, minX, maxX, minY, maxY);
    
    numXTiles = new int[numXLevels];
    numYTiles = new int[numYLevels];

    calculateNumTiles (numXTiles,
		       numXLevels,
		       minX, maxX,
		       tileDesc.xSize,
		       tileDesc.roundingMode);

    calculateNumTiles (numYTiles,
		       numYLevels,
		       minY, maxY,
		       tileDesc.ySize,
		       tileDesc.roundingMode);
}